

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Parse(ParserImpl *this,Message *output)

{
  bool bVar1;
  byte bVar2;
  LogMessage *pLVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  do {
    if ((this->tokenizer_).current_.type == TYPE_END) {
      bVar2 = this->had_errors_;
      if (((bool)bVar2 == false) && (this->recursion_limit_ != this->initial_recursion_limit_)) {
        internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x134);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: had_errors_ || recursion_limit_ == initial_recursion_limit_: "
                           );
        pLVar3 = internal::LogMessage::operator<<
                           (pLVar3,"Recursion limit at end of parse should be ");
        pLVar3 = internal::LogMessage::operator<<(pLVar3,this->initial_recursion_limit_);
        pLVar3 = internal::LogMessage::operator<<(pLVar3,", but was ");
        pLVar3 = internal::LogMessage::operator<<(pLVar3,this->recursion_limit_);
        pLVar3 = internal::LogMessage::operator<<(pLVar3,". Difference of ");
        pLVar3 = internal::LogMessage::operator<<
                           (pLVar3,this->initial_recursion_limit_ - this->recursion_limit_);
        pLVar3 = internal::LogMessage::operator<<
                           (pLVar3," stack frames not accounted for stack unwind.");
        internal::LogFinisher::operator=(&local_49,pLVar3);
        internal::LogMessage::~LogMessage(&local_48);
        bVar2 = this->had_errors_;
      }
      bVar2 = bVar2 ^ 1;
      goto LAB_003aef23;
    }
    bVar1 = ConsumeField(this,output);
  } while (bVar1);
  bVar2 = 0;
LAB_003aef23:
  return (bool)(bVar2 & 1);
}

Assistant:

bool Parse(Message* output) {
    // Consume fields until we cannot do so anymore.
    while (true) {
      if (LookingAtType(io::Tokenizer::TYPE_END)) {
        // Ensures recursion limit properly unwinded, but only for success
        // cases. This implicitly avoids the check when `Parse` returns false
        // via `DO(...)`.
        GOOGLE_DCHECK(had_errors_ || recursion_limit_ == initial_recursion_limit_)
            << "Recursion limit at end of parse should be "
            << initial_recursion_limit_ << ", but was " << recursion_limit_
            << ". Difference of " << initial_recursion_limit_ - recursion_limit_
            << " stack frames not accounted for stack unwind.";

        return !had_errors_;
      }

      DO(ConsumeField(output));
    }
  }